

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_ddd_open_list.hpp
# Opt level: O1

void __thiscall
astar_ddd::AstarDDDOpenList<Node<Tiles>_>::clear(AstarDDDOpenList<Node<Tiles>_> *this)

{
  pointer puVar1;
  pointer puVar2;
  named_fstream *pnVar3;
  pointer *__ptr;
  pointer puVar4;
  
  puVar1 = (this->open_buckets).
           super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->open_buckets).
           super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pnVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
               super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
               super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
      if (pnVar3 != (named_fstream *)0x0) {
        (**(code **)(*(long *)pnVar3 + 8))();
      }
      (puVar4->_M_t).super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
      super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
      super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl = (named_fstream *)0x0;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    (this->open_buckets).
    super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->next_buckets).
           super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->next_buckets).
           super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pnVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
               super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
               super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
      if (pnVar3 != (named_fstream *)0x0) {
        (**(code **)(*(long *)pnVar3 + 8))();
      }
      (puVar4->_M_t).super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
      super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
      super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl = (named_fstream *)0x0;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    (this->next_buckets).
    super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->closed_buckets).
           super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->closed_buckets).
           super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pnVar3 = (puVar4->_M_t).
               super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
               super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
               super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
      if (pnVar3 != (named_fstream *)0x0) {
        (**(code **)(*(long *)pnVar3 + 8))();
      }
      (puVar4->_M_t).super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
      super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
      super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl = (named_fstream *)0x0;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    (this->closed_buckets).
    super__Vector_base<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  pnVar3 = (this->recursive_bucket)._M_t.
           super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
           super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
           super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
  (this->recursive_bucket)._M_t.
  super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
  super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
  super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl = (named_fstream *)0x0;
  if (pnVar3 != (named_fstream *)0x0) {
    (**(code **)(*(long *)pnVar3 + 8))();
  }
  rmdir("open_list_buckets");
  dfpair(_stdout,"max bucket size (bytes)","%lu",this->max_bucket_size_in_bytes);
  return;
}

Assistant:

void AstarDDDOpenList<Entry>::clear() {
        open_buckets.clear();
        next_buckets.clear();
        closed_buckets.clear();
        recursive_bucket = nullptr;
        // remove empty directory, this fails if directory is not empty
        rmdir("open_list_buckets");
        dfpair(stdout, "max bucket size (bytes)", "%lu", max_bucket_size_in_bytes);
    }